

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.hpp
# Opt level: O1

void __thiscall Args::Help::process(Help *this,Context *context)

{
  pointer pcVar1;
  HelpPrinterIface *pHVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  ArgIface *pAVar6;
  HelpHasBeenPrintedException *this_00;
  ArgIface *pAVar7;
  ArgIface *pAVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  String arg;
  String local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pbVar9 = (context->m_it)._M_current;
  if (pbVar9 == (context->m_context).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar2 = (this->m_printer)._M_t.
             super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
             .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
    (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
  }
  else {
    (context->m_it)._M_current = pbVar9 + 1;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar1 = (pbVar9->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + pbVar9->_M_string_length);
    lVar5 = std::__cxx11::string::find((char *)&local_70,0x13089f,0);
    if ((lVar5 == 0) ||
       ((lVar5 = std::__cxx11::string::find((char *)&local_70,0x13089f,0), lVar5 != 0 &&
        (lVar5 = std::__cxx11::string::find((char)&local_70,0x2d), lVar5 == 0)))) {
      pHVar2 = (this->m_printer)._M_t.
               super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
               .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
      (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,&local_70,g_argsOutStream,0);
    }
    else {
      pHVar2 = (this->m_printer)._M_t.
               super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
               .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
      iVar4 = (*pHVar2->_vptr_HelpPrinterIface[8])(pHVar2,&local_70);
      pAVar6 = (ArgIface *)CONCAT44(extraout_var,iVar4);
      if ((pAVar6 == (ArgIface *)0x0) || (iVar4 = (*pAVar6->_vptr_ArgIface[2])(pAVar6), iVar4 != 0))
      {
        pHVar2 = (this->m_printer)._M_t.
                 super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                 .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
        (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
      }
      else {
        pbVar9 = (context->m_it)._M_current;
        pAVar8 = pAVar6;
        if (pbVar9 == (context->m_context).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          bVar3 = false;
        }
        else {
          do {
            (context->m_it)._M_current = pbVar9 + 1;
            std::__cxx11::string::_M_assign((string *)&local_70);
            if ((pAVar6 == (ArgIface *)0x0) ||
               (iVar4 = (*pAVar6->_vptr_ArgIface[2])(pAVar6), iVar4 != 0)) break;
            lVar5 = std::__cxx11::string::find((char *)&local_70,0x13089f,0);
            pAVar8 = pAVar6;
            if ((lVar5 == 0) ||
               ((lVar5 = std::__cxx11::string::find((char *)&local_70,0x13089f,0), lVar5 != 0 &&
                (lVar5 = std::__cxx11::string::find((char)&local_70,0x2d), lVar5 == 0)))) {
              pHVar2 = (this->m_printer)._M_t.
                       super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                       .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
              bVar3 = true;
              (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,&local_70,g_argsOutStream,pAVar6);
              goto LAB_0011dff9;
            }
            pAVar6 = Command::findChild((Command *)pAVar6,&local_70);
            pbVar9 = (context->m_it)._M_current;
          } while (pbVar9 != (context->m_context).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
          bVar3 = false;
        }
LAB_0011dff9:
        if (!bVar3) {
          pHVar2 = (this->m_printer)._M_t.
                   super___uniq_ptr_impl<Args::HelpPrinterIface,_std::default_delete<Args::HelpPrinterIface>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Args::HelpPrinterIface_*,_std::default_delete<Args::HelpPrinterIface>_>
                   .super__Head_base<0UL,_Args::HelpPrinterIface_*,_false>._M_head_impl;
          if (pAVar6 == (ArgIface *)0x0) {
            (*pHVar2->_vptr_HelpPrinterIface[2])(pHVar2,g_argsOutStream);
          }
          else {
            (*pAVar6->_vptr_ArgIface[3])(local_50,pAVar6);
            pAVar7 = (ArgIface *)0x0;
            if (pAVar8 != pAVar6) {
              pAVar7 = pAVar8;
            }
            (*pHVar2->_vptr_HelpPrinterIface[3])(pHVar2,local_50,g_argsOutStream,pAVar7);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  (this->super_Arg).m_isDefined = true;
  if (this->m_throwExceptionOnPrint == true) {
    this_00 = (HelpHasBeenPrintedException *)__cxa_allocate_exception(0x30);
    HelpHasBeenPrintedException::HelpHasBeenPrintedException(this_00);
    __cxa_throw(this_00,&HelpHasBeenPrintedException::typeinfo,BaseException::~BaseException);
  }
  return;
}

Assistant:

inline void
Help::process( Context & context )
{
	if( !context.atEnd() )
	{
		String arg = *context.next();

		// Argument or flag.
		if( details::isArgument( arg ) || details::isFlag( arg ) )
			m_printer->print( arg, g_argsOutStream );
		// Command?
		else
		{
			auto * tmp = m_printer->findArgument( arg );

			// Command.
			if( tmp && tmp->type() == ArgType::Command )
			{
				bool printed = false;

				auto * cmd = static_cast< Command* > ( tmp );

				while( !context.atEnd() )
				{
					arg = *context.next();

					if( tmp && tmp->type() == ArgType::Command )
					{
						cmd = static_cast< Command* > ( tmp );

						// Argument or flag.
						if( details::isArgument( arg ) || details::isFlag( arg ) )
						{
							m_printer->print( arg, g_argsOutStream, cmd );

							printed = true;

							break;
						}
						// Command?
						else
							tmp = cmd->findChild( arg );
					}
					else
						break;
				}

				if( !printed )
				{
					if( tmp )
						m_printer->print( tmp->name(), g_argsOutStream,
							( cmd != tmp ? cmd : nullptr ) );
					else
						m_printer->print( g_argsOutStream );
				}
			}
			else
				m_printer->print( g_argsOutStream );
		}
	}
	else
		m_printer->print( g_argsOutStream );

	setDefined( true );

	if( m_throwExceptionOnPrint )
		throw HelpHasBeenPrintedException();
}